

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

qsizetype QtPrivate::indexOf<QByteArray,char[2]>
                    (QList<QByteArray> *vector,char (*u) [2],qsizetype from)

{
  bool bVar1;
  qsizetype qVar2;
  longlong *plVar3;
  const_iterator cVar4;
  const_iterator *this;
  QList<QByteArray> *in_RDX;
  QList<QByteArray> *in_RDI;
  long in_FS_OFFSET;
  const_iterator e;
  const_iterator n;
  qsizetype in_stack_ffffffffffffff78;
  QList<QByteArray> *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffff90;
  QList<QByteArray> *local_68;
  qsizetype local_50;
  const_iterator local_20;
  longlong local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = in_RDX;
  if ((long)in_RDX < 0) {
    qVar2 = QList<QByteArray>::size(in_RDI);
    local_10 = (long)&(in_RDX->d).d + qVar2;
    local_18 = 0;
    plVar3 = qMax<long_long>(&local_10,&local_18);
    local_68 = (QList<QByteArray> *)*plVar3;
    in_stack_ffffffffffffff88 = in_RDX;
  }
  qVar2 = QList<QByteArray>::size(in_RDI);
  if ((long)local_68 < qVar2) {
    local_20.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QByteArray>::begin(local_68);
    QList<QByteArray>::const_iterator::operator+
              ((const_iterator *)local_68,in_stack_ffffffffffffff78);
    local_20 = QList<QByteArray>::const_iterator::operator-
                         ((const_iterator *)local_68,in_stack_ffffffffffffff78);
    cVar4 = QList<QByteArray>::end(local_68);
    do {
      this = QList<QByteArray>::const_iterator::operator++(&local_20);
      bVar1 = QList<QByteArray>::const_iterator::operator!=(this,cVar4);
      if (!bVar1) goto LAB_00338c31;
      QList<QByteArray>::const_iterator::operator*(&local_20);
      bVar1 = ::operator==(in_stack_ffffffffffffff90,(char **)in_stack_ffffffffffffff88);
    } while (!bVar1);
    cVar4 = QList<QByteArray>::begin(local_68);
    local_50 = QList<QByteArray>::const_iterator::operator-(&local_20,cVar4);
  }
  else {
LAB_00338c31:
    local_50 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}